

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O1

uint8_t * sysbvm_jit_installIn
                    (sysbvm_bytecodeJit_t *jit,uint8_t *codeWriteablePointer,
                    uint8_t *codeExecutablePointer)

{
  size_t __n;
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  uint8_t *puVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  uint8_t *baseAddress;
  long lVar11;
  long lVar12;
  uint8_t *ehFrameZoneExecutablePointer;
  uint8_t *local_58;
  long local_50;
  sysbvm_dwarf_debugInfo_builder_t *local_48;
  long local_40;
  ulong local_38;
  
  __n = (jit->objectFileHeader).size;
  uVar10 = __n + 0xf & 0xfffffffffffffff0;
  lVar12 = ((jit->instructions).size + 0xf & 0xfffffffffffffff0) + uVar10;
  local_50 = ((jit->constants).size + 0xf & 0xfffffffffffffff0) + lVar12;
  lVar11 = ((jit->unwindInfo).size + 0xf & 0xfffffffffffffff0) + local_50;
  local_40 = ((jit->dwarfEhBuilder).buffer.size + 0xf & 0xfffffffffffffff0) + lVar11;
  local_48 = &jit->dwarfDebugInfoBuilder;
  lVar5 = ((jit->dwarfDebugInfoBuilder).line.size + 0xf & 0xfffffffffffffff0) + local_40;
  lVar8 = ((jit->dwarfDebugInfoBuilder).str.size + 0xf & 0xfffffffffffffff0) + lVar5;
  lVar6 = ((jit->dwarfDebugInfoBuilder).abbrev.size + 0xf & 0xfffffffffffffff0) + lVar8;
  lVar9 = ((jit->dwarfDebugInfoBuilder).info.size + 0xf & 0xfffffffffffffff0) + lVar6;
  memcpy(codeWriteablePointer,(jit->objectFileHeader).data,__n);
  puVar7 = codeWriteablePointer + uVar10;
  baseAddress = codeExecutablePointer + uVar10;
  local_38 = uVar10;
  memcpy(puVar7,(jit->instructions).data,(jit->instructions).size);
  memcpy(codeWriteablePointer + lVar12,(jit->constants).data,(jit->constants).size);
  if ((jit->relocations).size != 0) {
    plVar4 = (long *)((jit->relocations).data + 0x18);
    uVar10 = 0;
    do {
      lVar1 = plVar4[-3];
      if ((int)plVar4[-2] == 1) {
        *(uint8_t **)(puVar7 + lVar1) =
             codeExecutablePointer + *plVar4 + ((plVar4[-1] + lVar12) - (long)(baseAddress + lVar1))
        ;
      }
      else if ((int)plVar4[-2] == 0) {
        *(int *)(puVar7 + lVar1) =
             (int)(codeExecutablePointer +
                  *plVar4 + ((plVar4[-1] + lVar12) - (long)(baseAddress + lVar1)));
      }
      uVar10 = uVar10 + 1;
      plVar4 = plVar4 + 4;
    } while (uVar10 < (jit->relocations).size);
  }
  memcpy(codeWriteablePointer + local_50,(jit->unwindInfo).data,(jit->unwindInfo).size);
  local_58 = codeExecutablePointer + lVar11;
  memcpy(codeWriteablePointer + lVar11,(jit->dwarfEhBuilder).buffer.data,
         (jit->dwarfEhBuilder).buffer.size);
  sysbvm_dwarf_debugInfo_patchTextAddressesRelativeTo(local_48,(uintptr_t)baseAddress);
  lVar12 = local_40;
  memcpy(codeWriteablePointer + local_40,(jit->dwarfDebugInfoBuilder).line.data,
         (jit->dwarfDebugInfoBuilder).line.size);
  memcpy(codeWriteablePointer + lVar5,(jit->dwarfDebugInfoBuilder).str.data,
         (jit->dwarfDebugInfoBuilder).str.size);
  memcpy(codeWriteablePointer + lVar8,(jit->dwarfDebugInfoBuilder).abbrev.data,
         (jit->dwarfDebugInfoBuilder).abbrev.size);
  memcpy(codeWriteablePointer + lVar6,(jit->dwarfDebugInfoBuilder).info.data,
         (jit->dwarfDebugInfoBuilder).info.size);
  puVar7 = codeWriteablePointer + lVar9;
  memcpy(puVar7,(jit->objectFileContent).data,(jit->objectFileContent).size);
  sVar2 = (jit->objectFileContent).size;
  sVar3 = (jit->dwarfEhBuilder).fdeInitialLocationOffset;
  if (sVar3 != 0) {
    *(int *)(codeWriteablePointer + lVar11 + sVar3) =
         ((int)baseAddress - (int)local_58) - (int)sVar3;
  }
  *(uint8_t **)(codeWriteablePointer + 0x28) =
       puVar7 + (sVar2 - (long)codeWriteablePointer) + -0x280;
  *(ulong *)(puVar7 + (sVar2 - 0x228)) = local_38;
  *(uint8_t **)(puVar7 + (sVar2 - 0x230)) = baseAddress;
  *(size_t *)(puVar7 + (sVar2 - 0x220)) = (jit->instructions).size;
  *(long *)(puVar7 + (sVar2 - 0x1e8)) = (long)local_58 - (long)codeExecutablePointer;
  *(uint8_t **)(puVar7 + (sVar2 - 0x1f0)) = local_58;
  sVar3 = (jit->dwarfEhBuilder).buffer.size;
  *(size_t *)(puVar7 + (sVar2 - 0x1e0)) = sVar3;
  *(long *)(puVar7 + (sVar2 - 0x1a8)) = lVar12;
  *(size_t *)(puVar7 + (sVar2 - 0x1a0)) = (jit->dwarfDebugInfoBuilder).line.size;
  *(long *)(puVar7 + (sVar2 - 0x168)) = lVar5;
  *(size_t *)(puVar7 + (sVar2 - 0x160)) = (jit->dwarfDebugInfoBuilder).str.size;
  *(long *)(puVar7 + (sVar2 - 0x128)) = lVar8;
  *(size_t *)(puVar7 + (sVar2 - 0x120)) = (jit->dwarfDebugInfoBuilder).abbrev.size;
  *(long *)(puVar7 + (sVar2 - 0xe8)) = lVar6;
  *(size_t *)(puVar7 + (sVar2 - 0xe0)) = (jit->dwarfDebugInfoBuilder).info.size;
  *(long *)(puVar7 + (sVar2 - 0xa8)) = *(long *)(puVar7 + (sVar2 - 0xa8)) + lVar9;
  *(long *)(puVar7 + (sVar2 - 0x68)) = *(long *)(puVar7 + (sVar2 - 0x68)) + lVar9;
  *(long *)(puVar7 + (sVar2 - 0x28)) = *(long *)(puVar7 + (sVar2 - 0x28)) + lVar9;
  if (sVar3 != 0) {
    sysbvm_dynarray_add(&jit->context->jittedRegisteredFrames,&local_58);
    __register_frame(local_58);
  }
  return baseAddress;
}

Assistant:

SYSBVM_API uint8_t *sysbvm_jit_installIn(sysbvm_bytecodeJit_t *jit, uint8_t *codeWriteablePointer, uint8_t *codeExecutablePointer)
{
    size_t objectFileHeaderOffset = 0;
    size_t codeOffset = sysbvm_sizeAlignedTo(jit->objectFileHeader.size, 16);
    size_t constantsOffset = codeOffset + sysbvm_sizeAlignedTo(jit->instructions.size, 16);

    size_t unwindInfoOffset = constantsOffset + sysbvm_sizeAlignedTo(jit->constants.size, 16);
    size_t ehFrameOffset = unwindInfoOffset + sysbvm_sizeAlignedTo(jit->unwindInfo.size, 16);
    size_t debugLineOffset = ehFrameOffset + sysbvm_sizeAlignedTo(jit->dwarfEhBuilder.buffer.size, 16);
    size_t debugStrOffset = debugLineOffset + sysbvm_sizeAlignedTo(jit->dwarfDebugInfoBuilder.line.size, 16);
    size_t debugAbbrevOffset = debugStrOffset + sysbvm_sizeAlignedTo(jit->dwarfDebugInfoBuilder.str.size, 16);
    size_t debugInfoOffset = debugAbbrevOffset + sysbvm_sizeAlignedTo(jit->dwarfDebugInfoBuilder.abbrev.size, 16);

    size_t objectFileContentOffset = debugInfoOffset + sysbvm_sizeAlignedTo(jit->dwarfDebugInfoBuilder.info.size, 16);

    uint8_t *objectFileHeaderPointer = codeWriteablePointer + objectFileHeaderOffset;
    uint8_t *objectFileHeaderExecutablePointer = codeExecutablePointer + objectFileHeaderOffset;
    memcpy(objectFileHeaderPointer, jit->objectFileHeader.data, jit->objectFileHeader.size);

    uint8_t *instructionsPointers = codeWriteablePointer + codeOffset;
    uint8_t *instructionsExecutablePointers = codeExecutablePointer + codeOffset;
    memcpy(instructionsPointers, jit->instructions.data, jit->instructions.size);

    uint8_t *constantZonePointer = codeWriteablePointer + constantsOffset;
    uint8_t *constantZoneExecutablePointer = codeExecutablePointer + constantsOffset;
    memcpy(constantZonePointer, jit->constants.data, jit->constants.size);

    for(size_t i = 0; i < jit->relocations.size; ++i)
    {
        sysbvm_bytecodeJitRelocation_t *relocation = sysbvm_dynarray_entryOfTypeAt(jit->relocations, sysbvm_bytecodeJitRelocation_t, i);
        uint8_t *relocationTarget = instructionsPointers + relocation->offset;
        uint8_t *relocationExecutableTarget = instructionsExecutablePointers + relocation->offset;
        intptr_t relocationTargetAddress = (intptr_t)relocationExecutableTarget;

        intptr_t relativeValue = (intptr_t)constantZoneExecutablePointer + relocation->value - relocationTargetAddress + relocation->addend;
        switch(relocation->type)
        {
        case SYSBVM_BYTECODE_JIT_RELOCATION_RELATIVE32:
            *((int32_t*)relocationTarget) = (int32_t)relativeValue;
            break;
        case SYSBVM_BYTECODE_JIT_RELOCATION_RELATIVE64:
            *((int64_t*)relocationTarget) = (int64_t)relativeValue;
            break;
        }
    }

    uint8_t *unwindInfoZonePointer = codeWriteablePointer + unwindInfoOffset;
    uint8_t *unwindInfoZoneExecutablePointer = codeExecutablePointer + unwindInfoOffset;
    memcpy(unwindInfoZonePointer, jit->unwindInfo.data, jit->unwindInfo.size);

    uint8_t *ehFrameZonePointer = codeWriteablePointer + ehFrameOffset;
    uint8_t *ehFrameZoneExecutablePointer = codeExecutablePointer + ehFrameOffset;
    memcpy(ehFrameZonePointer, jit->dwarfEhBuilder.buffer.data, jit->dwarfEhBuilder.buffer.size);

    sysbvm_dwarf_debugInfo_patchTextAddressesRelativeTo(&jit->dwarfDebugInfoBuilder, (uintptr_t)instructionsExecutablePointers);

    uint8_t *debugLineZonePointer = codeWriteablePointer + debugLineOffset;
    uint8_t *debugLineZoneExecutablePointer = codeExecutablePointer + debugLineOffset;
    memcpy(debugLineZonePointer, jit->dwarfDebugInfoBuilder.line.data, jit->dwarfDebugInfoBuilder.line.size);

    uint8_t *debugStrZonePointer = codeWriteablePointer + debugStrOffset;
    uint8_t *debugStrZoneExecutablePointer = codeExecutablePointer + debugStrOffset;
    memcpy(debugStrZonePointer, jit->dwarfDebugInfoBuilder.str.data, jit->dwarfDebugInfoBuilder.str.size);

    uint8_t *debugAbbrevZonePointer = codeWriteablePointer + debugAbbrevOffset;
    uint8_t *debugAbbrevZoneExecutablePointer = codeExecutablePointer + debugAbbrevOffset;
    memcpy(debugAbbrevZonePointer, jit->dwarfDebugInfoBuilder.abbrev.data, jit->dwarfDebugInfoBuilder.abbrev.size);

    uint8_t *debugInfoZonePointer = codeWriteablePointer + debugInfoOffset;
    uint8_t *debugInfoZoneExecutablePointer = codeExecutablePointer + debugInfoOffset;
    memcpy(debugInfoZonePointer, jit->dwarfDebugInfoBuilder.info.data, jit->dwarfDebugInfoBuilder.info.size);

    uint8_t *objectFileContentPointer = codeWriteablePointer + objectFileContentOffset;
    uint8_t *objectFileContentExecutablePointer = codeExecutablePointer + objectFileContentOffset;
    memcpy(objectFileContentPointer, jit->objectFileContent.data, jit->objectFileContent.size);

    sysbvm_jit_fixupObjectFile(jit,
        (sysbvm_elf64_header_t*)objectFileHeaderPointer,
        (sysbvm_elf64_header_t*)objectFileHeaderExecutablePointer,
        instructionsExecutablePointers,
        ehFrameZonePointer, ehFrameZoneExecutablePointer,
        debugLineZoneExecutablePointer,
        debugStrZoneExecutablePointer,
        debugAbbrevZoneExecutablePointer,
        debugInfoZoneExecutablePointer,
        objectFileContentExecutablePointer,
        (sysbvm_jit_x64_elfContentFooter_t*) (objectFileContentPointer + jit->objectFileContent.size - sizeof(sysbvm_jit_x64_elfContentFooter_t))
    );

    sysbvm_jit_emitPerfSymbolFor(jit, instructionsPointers);

#ifdef _WIN32
    RUNTIME_FUNCTION *runtimeFunction = (RUNTIME_FUNCTION*)unwindInfoZoneExecutablePointer;
    runtimeFunction->UnwindInfoAddress = (DWORD)(sizeof(RUNTIME_FUNCTION) + unwindInfoZoneExecutablePointer - instructionsExecutablePointers);
    if(RtlAddFunctionTable(runtimeFunction, 1, (DWORD64)(uintptr_t)instructionsExecutablePointers))
    {
        // Store the handle in the context for cleanup.
    }
#else
    (void)unwindInfoZoneExecutablePointer;
    if(jit->dwarfEhBuilder.buffer.size > 0)
    {
#   ifdef __APPLE__
        // It takes the FDE parameter
        if(jit->dwarfEhBuilder.fdeOffset > 0)
        {
            void *fdePointer = ehFrameZoneExecutablePointer + jit->dwarfEhBuilder.fdeOffset;
            sysbvm_dynarray_add(&jit->context->jittedRegisteredFrames, &fdePointer);
            __register_frame(fdePointer);
        }
#   else
        // Send the eh_frame section.
        sysbvm_dynarray_add(&jit->context->jittedRegisteredFrames, &ehFrameZoneExecutablePointer);
        __register_frame(ehFrameZoneExecutablePointer);
#   endif
    }
#endif

    return instructionsExecutablePointers;
}